

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

void __thiscall
booster::callback<void(std::error_code_const&)>::
callback<cppcms::impl::cgi::socket_acceptor<cppcms::impl::cgi::http,cppcms::impl::cgi::http_creator>::accept_binder>
          (callback<void(std::error_code_const&)> *this,accept_binder func)

{
  callable_impl<void,_cppcms::impl::cgi::socket_acceptor<cppcms::impl::cgi::http,_cppcms::impl::cgi::http_creator>::accept_binder>
  *this_00;
  
  this_00 = (callable_impl<void,_cppcms::impl::cgi::socket_acceptor<cppcms::impl::cgi::http,_cppcms::impl::cgi::http_creator>::accept_binder>
             *)operator_new(0x18);
  callback<void_(const_std::error_code_&)>::
  callable_impl<void,_cppcms::impl::cgi::socket_acceptor<cppcms::impl::cgi::http,_cppcms::impl::cgi::http_creator>::accept_binder>
  ::callable_impl(this_00,func);
  *(callable_impl<void,_cppcms::impl::cgi::socket_acceptor<cppcms::impl::cgi::http,_cppcms::impl::cgi::http_creator>::accept_binder>
    **)this = this_00;
  booster::atomic_counter::inc();
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}